

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O0

BVIndex __thiscall BVFixed::GetNextBit(BVFixed *this,BVIndex i)

{
  BVIndex BVar1;
  BVUnit *pBVar2;
  BVIndex local_2c;
  BVIndex offset;
  BVIndex base;
  BVUnit *chunk;
  BVIndex i_local;
  BVFixed *this_local;
  
  AssertRange(this,i);
  _offset = BitsFromIndex(this,i);
  local_2c = BVUnitT<unsigned_long>::Floor(i);
  BVar1 = BVUnitT<unsigned_long>::Offset(i);
  BVar1 = BVUnitT<unsigned_long>::GetNextBit(_offset,BVar1);
  if (BVar1 == 0xffffffff) {
    do {
      _offset = _offset + 1;
      pBVar2 = EndUnit(this);
      if (_offset == pBVar2) {
        return 0xffffffff;
      }
      local_2c = local_2c + 0x40;
      BVar1 = BVUnitT<unsigned_long>::GetNextBit(_offset);
    } while (BVar1 == 0xffffffff);
    this_local._4_4_ = local_2c + BVar1;
  }
  else {
    this_local._4_4_ = local_2c + BVar1;
  }
  return this_local._4_4_;
}

Assistant:

BVIndex
BVFixed::GetNextBit(BVIndex i) const
{
    AssertRange(i);

    const   BVUnit * chunk      = BitsFromIndex(i);
            BVIndex  base       = BVUnit::Floor(i);


    BVIndex offset = chunk->GetNextBit(BVUnit::Offset(i));
    if(-1 != offset)
    {
        return base + offset;
    }

    while(++chunk != this->EndUnit())
    {
        base  += BVUnit::BitsPerWord;
        offset = chunk->GetNextBit();
        if(-1 != offset)
        {
            return base + offset;
        }
    }

   return BVInvalidIndex;
}